

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O0

int lws_callback_on_writable_all_protocol(lws_context *context,lws_protocols *protocol)

{
  int iVar1;
  int local_2c;
  lws_vhost *plStack_28;
  int n;
  lws_vhost *vhost;
  lws_protocols *protocol_local;
  lws_context *context_local;
  
  if (context != (lws_context *)0x0) {
    for (plStack_28 = context->vhost_list; plStack_28 != (lws_vhost *)0x0;
        plStack_28 = plStack_28->vhost_next) {
      local_2c = 0;
      while ((local_2c < plStack_28->count_protocols &&
             ((protocol->callback != plStack_28->protocols[local_2c].callback ||
              (iVar1 = strcmp(protocol->name,plStack_28->protocols[local_2c].name), iVar1 != 0)))))
      {
        local_2c = local_2c + 1;
      }
      if (local_2c != plStack_28->count_protocols) {
        lws_callback_on_writable_all_protocol_vhost(plStack_28,plStack_28->protocols + local_2c);
      }
    }
  }
  return 0;
}

Assistant:

int
lws_callback_on_writable_all_protocol(const struct lws_context *context,
				      const struct lws_protocols *protocol)
{
	struct lws_vhost *vhost;
	int n;

	if (!context)
		return 0;

	vhost = context->vhost_list;

	while (vhost) {
		for (n = 0; n < vhost->count_protocols; n++)
			if (protocol->callback ==
			     vhost->protocols[n].callback &&
			    !strcmp(protocol->name, vhost->protocols[n].name))
				break;
		if (n != vhost->count_protocols)
			lws_callback_on_writable_all_protocol_vhost(
				vhost, &vhost->protocols[n]);

		vhost = vhost->vhost_next;
	}

	return 0;
}